

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoding.c
# Opt level: O2

exr_result_t default_read_chunk(exr_decode_pipeline_t *decode)

{
  exr_const_context_t_conflict ctxt;
  exr_priv_part_t p_Var1;
  size_t sVar2;
  exr_result_t eVar3;
  long lVar4;
  void *packed_data;
  int part_index;
  void *sample_data;
  
  ctxt = decode->context;
  if (ctxt == (exr_const_context_t_conflict)0x0) {
    eVar3 = 2;
  }
  else {
    if (ctxt->mode != '\0') {
      eVar3 = (*ctxt->standard_error)(ctxt,7);
      return eVar3;
    }
    lVar4 = (long)decode->part_index;
    if ((lVar4 < 0) || (ctxt->num_parts <= decode->part_index)) {
      eVar3 = (*ctxt->print_error)(ctxt,4,"Part index (%d) out of range",lVar4,ctxt->print_error);
      return eVar3;
    }
    p_Var1 = ctxt->parts[lVar4];
    if ((decode->unpacked_buffer == decode->packed_buffer) && (decode->unpacked_alloc_size == 0)) {
      decode->unpacked_buffer = (void *)0x0;
    }
    if (((p_Var1->storage_mode & ~EXR_STORAGE_TILED) == EXR_STORAGE_DEEP_SCANLINE) &&
       (sVar2 = (decode->chunk).sample_count_table_size, sVar2 != 0)) {
      eVar3 = internal_decode_alloc_buffer
                        (decode,EXR_TRANSCODE_BUFFER_PACKED_SAMPLES,
                         &decode->packed_sample_count_table,&decode->packed_sample_count_alloc_size,
                         sVar2);
      if (eVar3 == 0) {
        if ((decode->decode_flags & 4) == 0) {
          eVar3 = internal_decode_alloc_buffer
                            (decode,EXR_TRANSCODE_BUFFER_PACKED,&decode->packed_buffer,
                             &decode->packed_alloc_size,(decode->chunk).packed_size);
          if (eVar3 != 0) {
            return eVar3;
          }
          part_index = decode->part_index;
          packed_data = decode->packed_buffer;
          sample_data = decode->packed_sample_count_table;
        }
        else {
          part_index = decode->part_index;
          sample_data = decode->packed_sample_count_table;
          packed_data = (void *)0x0;
        }
        eVar3 = exr_read_deep_chunk(ctxt,part_index,&decode->chunk,packed_data,sample_data);
        return eVar3;
      }
    }
    else {
      sVar2 = (decode->chunk).packed_size;
      if (sVar2 == 0) {
        eVar3 = 0;
      }
      else {
        eVar3 = internal_decode_alloc_buffer
                          (decode,EXR_TRANSCODE_BUFFER_PACKED,&decode->packed_buffer,
                           &decode->packed_alloc_size,sVar2);
        if (eVar3 == 0) {
          eVar3 = exr_read_chunk(ctxt,decode->part_index,&decode->chunk,decode->packed_buffer);
          return eVar3;
        }
      }
    }
  }
  return eVar3;
}

Assistant:

static exr_result_t
default_read_chunk (exr_decode_pipeline_t* decode)
{
    exr_result_t        rv;
    exr_const_context_t ctxt = decode->context;
    EXR_READONLY_AND_DEFINE_PART (decode->part_index);

    if (decode->unpacked_buffer == decode->packed_buffer &&
        decode->unpacked_alloc_size == 0)
        decode->unpacked_buffer = NULL;

    if ((part->storage_mode == EXR_STORAGE_DEEP_SCANLINE ||
         part->storage_mode == EXR_STORAGE_DEEP_TILED) &&
        decode->chunk.sample_count_table_size > 0)
    {
        rv = internal_decode_alloc_buffer (
            decode,
            EXR_TRANSCODE_BUFFER_PACKED_SAMPLES,
            &(decode->packed_sample_count_table),
            &(decode->packed_sample_count_alloc_size),
            decode->chunk.sample_count_table_size);
        if (rv != EXR_ERR_SUCCESS) return rv;

        if ((decode->decode_flags & EXR_DECODE_SAMPLE_DATA_ONLY))
        {
            rv = exr_read_deep_chunk (
                ctxt,
                decode->part_index,
                &(decode->chunk),
                NULL,
                decode->packed_sample_count_table);
        }
        else
        {
            rv = internal_decode_alloc_buffer (
                decode,
                EXR_TRANSCODE_BUFFER_PACKED,
                &(decode->packed_buffer),
                &(decode->packed_alloc_size),
                decode->chunk.packed_size);
            if (rv != EXR_ERR_SUCCESS) return rv;

            rv = exr_read_deep_chunk (
                ctxt,
                decode->part_index,
                &(decode->chunk),
                decode->packed_buffer,
                decode->packed_sample_count_table);
        }
    }
    else if (decode->chunk.packed_size > 0)
    {
        rv = internal_decode_alloc_buffer (
            decode,
            EXR_TRANSCODE_BUFFER_PACKED,
            &(decode->packed_buffer),
            &(decode->packed_alloc_size),
            decode->chunk.packed_size);
        if (rv != EXR_ERR_SUCCESS) return rv;
        rv = exr_read_chunk (
            ctxt, decode->part_index, &(decode->chunk), decode->packed_buffer);
    }
    else
        rv = EXR_ERR_SUCCESS;

    return rv;
}